

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Executor_RegVm.cpp
# Opt level: O2

bool __thiscall ExecutorRegVm::RemoveBreakpoint(ExecutorRegVm *this,uint instruction)

{
  RegVmCmd *pRVar1;
  RegVmCmd *pRVar2;
  
  if ((this->exLinker->exRegVmCode).count < instruction) {
    NULLC::SafeSprintf(this->execErrorBuffer,0x10000,"ERROR: break position out of code range");
  }
  else {
    pRVar1 = FastVector<RegVmCmd,_false,_false>::operator[]
                       (&this->exLinker->exRegVmCode,instruction);
    if (pRVar1->code == '\0') {
      pRVar1 = FastVector<RegVmCmd,_false,_false>::operator[]
                         (&this->exLinker->exRegVmCode,instruction);
      pRVar1 = FastVector<RegVmCmd,_false,_false>::operator[](&this->breakCode,pRVar1->argument);
      pRVar2 = FastVector<RegVmCmd,_false,_false>::operator[]
                         (&this->exLinker->exRegVmCode,instruction);
      *pRVar2 = *pRVar1;
      return true;
    }
    NULLC::SafeSprintf(this->execErrorBuffer,0x10000,
                       "ERROR: there is no breakpoint at instruction %d",(ulong)instruction);
  }
  this->execErrorMessage = this->execErrorBuffer;
  return false;
}

Assistant:

bool ExecutorRegVm::RemoveBreakpoint(unsigned instruction)
{
	if(instruction > exLinker->exRegVmCode.size())
	{
		NULLC::SafeSprintf(execErrorBuffer, NULLC_ERROR_BUFFER_SIZE, "ERROR: break position out of code range");
		execErrorMessage = execErrorBuffer;
		return false;
	}

	if(exLinker->exRegVmCode[instruction].code != rviNop)
	{
		NULLC::SafeSprintf(execErrorBuffer, NULLC_ERROR_BUFFER_SIZE, "ERROR: there is no breakpoint at instruction %d", instruction);
		execErrorMessage = execErrorBuffer;
		return false;
	}

	exLinker->exRegVmCode[instruction] = breakCode[exLinker->exRegVmCode[instruction].argument];
	return true;
}